

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Attribute.h
# Opt level: O2

void __thiscall adios2::core::Attribute<unsigned_int>::~Attribute(Attribute<unsigned_int> *this)

{
  (this->super_AttributeBase)._vptr_AttributeBase = (_func_int **)&PTR__Attribute_00819520;
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&(this->m_DataArray).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  AttributeBase::~AttributeBase(&this->super_AttributeBase);
  return;
}

Assistant:

~Attribute() = default;